

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O1

Move<vk::VkDevice_s_*> * __thiscall
vkt::sr::ShaderRenderCaseInstance::SparseContext::createDevice
          (Move<vk::VkDevice_s_*> *__return_storage_ptr__,SparseContext *this)

{
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  float queuePriority;
  VkDeviceQueueCreateInfo queueInfo;
  VkDeviceCreateInfo deviceInfo;
  VkPhysicalDeviceFeatures deviceFeatures;
  float local_18c;
  VkDeviceQueueCreateInfo local_188;
  VkDeviceCreateInfo local_158;
  VkPhysicalDeviceFeatures local_104;
  
  vk = Context::getInstanceInterface(this->m_context);
  physicalDevice = Context::getPhysicalDevice(this->m_context);
  ::vk::getPhysicalDeviceFeatures(&local_104,vk,physicalDevice);
  local_188.pQueuePriorities = &local_18c;
  local_18c = 1.0;
  local_158.pQueueCreateInfos = &local_188;
  local_188.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
  local_188._4_4_ = 0;
  local_188.pNext = (void *)0x0;
  local_188._16_8_ = (ulong)this->m_queueFamilyIndex << 0x20;
  local_188.queueCount = 1;
  local_188._28_4_ = 0;
  local_158.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
  local_158._4_4_ = 0;
  local_158.pNext = (void *)0x0;
  local_158.flags = 0;
  local_158.queueCreateInfoCount = 1;
  local_158.enabledExtensionCount = 0;
  local_158._52_4_ = 0;
  local_158.ppEnabledExtensionNames = (char **)0x0;
  local_158.enabledLayerCount = 0;
  local_158._36_4_ = 0;
  local_158.ppEnabledLayerNames = (char **)0x0;
  local_158.pEnabledFeatures = &local_104;
  ::vk::createDevice(__return_storage_ptr__,vk,physicalDevice,&local_158,
                     (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkDevice> ShaderRenderCaseInstance::SparseContext::createDevice () const
{
	const InstanceInterface&				vk					= m_context.getInstanceInterface();
	const VkPhysicalDevice					physicalDevice		= m_context.getPhysicalDevice();
	const VkPhysicalDeviceFeatures			deviceFeatures		= getPhysicalDeviceFeatures(vk, physicalDevice);

	VkDeviceQueueCreateInfo					queueInfo;
	VkDeviceCreateInfo						deviceInfo;
	const float								queuePriority		= 1.0f;

	deMemset(&queueInfo,	0, sizeof(queueInfo));
	deMemset(&deviceInfo,	0, sizeof(deviceInfo));

	queueInfo.sType							= VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
	queueInfo.pNext							= DE_NULL;
	queueInfo.flags							= (VkDeviceQueueCreateFlags)0u;
	queueInfo.queueFamilyIndex				= m_queueFamilyIndex;
	queueInfo.queueCount					= 1u;
	queueInfo.pQueuePriorities				= &queuePriority;

	deviceInfo.sType						= VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
	deviceInfo.pNext						= DE_NULL;
	deviceInfo.queueCreateInfoCount			= 1u;
	deviceInfo.pQueueCreateInfos			= &queueInfo;
	deviceInfo.enabledExtensionCount		= 0u;
	deviceInfo.ppEnabledExtensionNames		= DE_NULL;
	deviceInfo.enabledLayerCount			= 0u;
	deviceInfo.ppEnabledLayerNames			= DE_NULL;
	deviceInfo.pEnabledFeatures				= &deviceFeatures;

	return vk::createDevice(vk, physicalDevice, &deviceInfo);
}